

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_point_read_binary
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,uchar *buf,size_t ilen)

{
  size_t buflen;
  size_t plen;
  int ret;
  size_t ilen_local;
  uchar *buf_local;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  if (ilen == 0) {
    grp_local._4_4_ = -0x4f80;
  }
  else if (*buf == '\0') {
    if (ilen == 1) {
      grp_local._4_4_ = mbedtls_ecp_set_zero(pt);
    }
    else {
      grp_local._4_4_ = -0x4f80;
    }
  }
  else {
    buflen = mbedtls_mpi_size(&grp->P);
    if (*buf == '\x04') {
      if (ilen == buflen * 2 + 1) {
        plen._4_4_ = mbedtls_mpi_read_binary(&pt->X,buf + 1,buflen);
        if ((plen._4_4_ == 0) &&
           (plen._4_4_ = mbedtls_mpi_read_binary(&pt->Y,buf + buflen + 1,buflen), plen._4_4_ == 0))
        {
          plen._4_4_ = mbedtls_mpi_lset(&pt->Z,1);
        }
        grp_local._4_4_ = plen._4_4_;
      }
      else {
        grp_local._4_4_ = -0x4f80;
      }
    }
    else {
      grp_local._4_4_ = -0x4e80;
    }
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_point_read_binary( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt,
                           const unsigned char *buf, size_t ilen )
{
    int ret;
    size_t plen;

    if( ilen < 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( buf[0] == 0x00 )
    {
        if( ilen == 1 )
            return( mbedtls_ecp_set_zero( pt ) );
        else
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    }

    plen = mbedtls_mpi_size( &grp->P );

    if( buf[0] != 0x04 )
        return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

    if( ilen != 2 * plen + 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &pt->X, buf + 1, plen ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &pt->Y, buf + 1 + plen, plen ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );

cleanup:
    return( ret );
}